

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O3

ConversionResult
llvm::ConvertUTF32toUTF8
          (UTF32 **sourceStart,UTF32 *sourceEnd,UTF8 **targetStart,UTF8 *targetEnd,
          ConversionFlags flags)

{
  uint uVar1;
  uint *puVar2;
  UTF8 *pUVar3;
  ConversionResult CVar4;
  ushort uVar5;
  
  puVar2 = *sourceStart;
  pUVar3 = *targetStart;
  CVar4 = conversionOK;
  if (puVar2 < sourceEnd) {
    uVar1 = *puVar2;
    if ((uVar1 & 0xfffff800) == 0xd800 && flags == strictConversion) {
      CVar4 = sourceIllegal;
    }
    else {
      uVar5 = 1;
      if (((0x7f < uVar1) && (uVar5 = 2, 0x7ff < uVar1)) && (uVar5 = 3, 0xffff < uVar1)) {
        uVar5 = (uVar1 < 0x110000) + 3;
      }
      if (pUVar3 + uVar5 <= targetEnd) {
        CVar4 = (*(code *)((long)&DAT_00169d10 + (long)(int)(&DAT_00169d10)[uVar5 - 1]))();
        return CVar4;
      }
      CVar4 = targetExhausted;
    }
  }
  *sourceStart = puVar2;
  *targetStart = pUVar3;
  return CVar4;
}

Assistant:

ConversionResult ConvertUTF32toUTF8 (
        const UTF32** sourceStart, const UTF32* sourceEnd,
        UTF8** targetStart, UTF8* targetEnd, ConversionFlags flags) {
    ConversionResult result = conversionOK;
    const UTF32* source = *sourceStart;
    UTF8* target = *targetStart;
    while (source < sourceEnd) {
        UTF32 ch;
        unsigned short bytesToWrite = 0;
        const UTF32 byteMask = 0xBF;
        const UTF32 byteMark = 0x80;
        ch = *source++;
        if (flags == strictConversion ) {
            /* UTF-16 surrogate values are illegal in UTF-32 */
            if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_LOW_END) {
                --source; /* return to the illegal value itself */
                result = sourceIllegal;
                break;
            }
        }
        /*
         * Figure out how many bytes the result will require. Turn any
         * illegally large UTF32 things (> Plane 17) into replacement chars.
         */
        if (ch < (UTF32)0x80) {      bytesToWrite = 1;
        } else if (ch < (UTF32)0x800) {     bytesToWrite = 2;
        } else if (ch < (UTF32)0x10000) {   bytesToWrite = 3;
        } else if (ch <= UNI_MAX_LEGAL_UTF32) {  bytesToWrite = 4;
        } else {                            bytesToWrite = 3;
                                            ch = UNI_REPLACEMENT_CHAR;
                                            result = sourceIllegal;
        }

        target += bytesToWrite;
        if (target > targetEnd) {
            --source; /* Back up source pointer! */
            target -= bytesToWrite; result = targetExhausted; break;
        }
        switch (bytesToWrite) { /* note: everything falls through. */
            case 4: *--target = (UTF8)((ch | byteMark) & byteMask); ch >>= 6;
            case 3: *--target = (UTF8)((ch | byteMark) & byteMask); ch >>= 6;
            case 2: *--target = (UTF8)((ch | byteMark) & byteMask); ch >>= 6;
            case 1: *--target = (UTF8) (ch | firstByteMark[bytesToWrite]);
        }
        target += bytesToWrite;
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}